

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::populate_initial_block_list
          (ConcurrentQueue<_zframe_t_*,_MyTraits> *this,size_t blockCount)

{
  Block *pBVar1;
  undefined8 in_RSI;
  long in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffe8;
  ulong uVar2;
  
  *(undefined8 *)(in_RDI + 0x20) = in_RSI;
  if (*(long *)(in_RDI + 0x20) == 0) {
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  else {
    pBVar1 = ConcurrentQueue<_zframe_t*,MyTraits>::
             create_array<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::Block>
                       (in_stack_ffffffffffffffe8);
    *(Block **)(in_RDI + 0x18) = pBVar1;
    if (*(long *)(in_RDI + 0x18) == 0) {
      *(undefined8 *)(in_RDI + 0x20) = 0;
    }
    for (uVar2 = 0; uVar2 < *(ulong *)(in_RDI + 0x20); uVar2 = uVar2 + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + uVar2 * 0x830 + 0x821) = 0;
    }
  }
  return;
}

Assistant:

void populate_initial_block_list(size_t blockCount)
	{
		initialBlockPoolSize = blockCount;
		if (initialBlockPoolSize == 0) {
			initialBlockPool = nullptr;
			return;
		}
		
		initialBlockPool = create_array<Block>(blockCount);
		if (initialBlockPool == nullptr) {
			initialBlockPoolSize = 0;
		}
		for (size_t i = 0; i < initialBlockPoolSize; ++i) {
			initialBlockPool[i].dynamicallyAllocated = false;
		}
	}